

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O2

bool bssl::add_outgoing(SSL *ssl,bool is_ccs,Array<unsigned_char> *data)

{
  uint16_t *puVar1;
  SSL_HANDSHAKE *pSVar2;
  Span<const_unsigned_char> in;
  bool bVar3;
  size_t sVar4;
  DTLSOutgoingMessage *pDVar5;
  DTLS1_STATE *pDVar6;
  int reason;
  int line;
  DTLSOutgoingMessage msg;
  DTLSOutgoingMessage local_48;
  
  if ((undefined1  [1016])((undefined1  [1016])*ssl->d1 & (undefined1  [1016])0x2) !=
      (undefined1  [1016])0x0) {
    dtls1_stop_timer(ssl);
    dtls_clear_outgoing_messages(ssl);
  }
  if (!is_ccs) {
    pDVar6 = ssl->d1;
    if ((undefined1  [1016])((undefined1  [1016])*pDVar6 & (undefined1  [1016])0x8) !=
        (undefined1  [1016])0x0) {
      reason = 0x45;
      line = 0x24b;
LAB_001657c7:
      ERR_put_error(0x10,0,reason,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                    ,line);
      return false;
    }
    pSVar2 = (ssl->s3->hs)._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl;
    if (pSVar2 != (SSL_HANDSHAKE *)0x0) {
      in.data_ = data->data_;
      in.size_ = data->size_;
      bVar3 = SSLTranscript::Update(&pSVar2->transcript,in);
      if (!bVar3) {
        reason = 0x44;
        line = 0x251;
        goto LAB_001657c7;
      }
      pDVar6 = ssl->d1;
    }
    puVar1 = &pDVar6->handshake_write_seq;
    *puVar1 = *puVar1 + 1;
    if (*puVar1 == 0) {
      *(byte *)pDVar6 = *(byte *)pDVar6 | 8;
    }
  }
  msg.acked.bytes_.data_ = (uchar *)0x0;
  msg.acked.bytes_.size_ = 0;
  msg.acked.first_unmarked_byte_ = 0;
  msg.data.data_ = (uchar *)0x0;
  msg.data.size_._0_7_ = 0;
  msg.data.size_._7_1_ = 0;
  msg.epoch = 0;
  msg.is_ccs = false;
  Array<unsigned_char>::operator=(&msg.data,data);
  pDVar6 = ssl->d1;
  msg.epoch = *(uint16_t *)((long)&(pDVar6->write_epoch).next_record.combined_ + 6);
  msg.is_ccs = is_ccs;
  if (!is_ccs) {
    sVar4 = DTLSOutgoingMessage::msg_len(&msg);
    bVar3 = DTLSMessageBitmap::Init(&msg.acked,sVar4 + (sVar4 == 0));
    if (!bVar3) {
      bVar3 = false;
      goto LAB_001657a6;
    }
    pDVar6 = ssl->d1;
  }
  DTLSOutgoingMessage::DTLSOutgoingMessage(&local_48,&msg);
  pDVar5 = InplaceVector<bssl::DTLSOutgoingMessage,_7UL>::TryPushBack
                     (&pDVar6->outgoing_messages,&local_48);
  DTLSOutgoingMessage::~DTLSOutgoingMessage(&local_48);
  bVar3 = true;
  if (pDVar5 == (DTLSOutgoingMessage *)0x0) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                  ,0x26c,"bool bssl::add_outgoing(SSL *, bool, Array<uint8_t>)");
  }
LAB_001657a6:
  DTLSOutgoingMessage::~DTLSOutgoingMessage(&msg);
  return bVar3;
}

Assistant:

static bool add_outgoing(SSL *ssl, bool is_ccs, Array<uint8_t> data) {
  if (ssl->d1->outgoing_messages_complete) {
    // If we've begun writing a new flight, we received the peer flight. Discard
    // the timer and the our flight.
    dtls1_stop_timer(ssl);
    dtls_clear_outgoing_messages(ssl);
  }

  if (!is_ccs) {
    if (ssl->d1->handshake_write_overflow) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
      return false;
    }
    // TODO(svaldez): Move this up a layer to fix abstraction for SSLTranscript
    // on hs.
    if (ssl->s3->hs != NULL && !ssl->s3->hs->transcript.Update(data)) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
    ssl->d1->handshake_write_seq++;
    if (ssl->d1->handshake_write_seq == 0) {
      ssl->d1->handshake_write_overflow = true;
    }
  }

  DTLSOutgoingMessage msg;
  msg.data = std::move(data);
  msg.epoch = ssl->d1->write_epoch.epoch();
  msg.is_ccs = is_ccs;
  // Zero-length messages need 1 bit to track whether the peer has received the
  // message header. (Normally the message header is implicitly received when
  // any fragment of the message is received at all.)
  if (!is_ccs && !msg.acked.Init(std::max(msg.msg_len(), size_t{1}))) {
    return false;
  }

  // This should not fail if |SSL_MAX_HANDSHAKE_FLIGHT| was sized correctly.
  //
  // TODO(crbug.com/42290594): This can currently fail in DTLS 1.3. The caller
  // can configure how many tickets to send, up to kMaxTickets. Additionally, if
  // we send 0.5-RTT tickets in 0-RTT, we may even have tickets queued up with
  // the server flight.
  if (!ssl->d1->outgoing_messages.TryPushBack(std::move(msg))) {
    assert(false);
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  return true;
}